

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

void __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::Scanner
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,Parser *parser,Token *ptoken,
          ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  CharClassifier *pCVar4;
  ScriptConfiguration *this_00;
  ScriptContext *scriptContext_local;
  Token *ptoken_local;
  Parser *parser_local;
  Scanner<UTF8EncodingPolicyBase<false>_> *this_local;
  
  IScanner::IScanner(&this->super_IScanner);
  UTF8EncodingPolicyBase<false>::UTF8EncodingPolicyBase(&this->super_UTF8EncodingPolicyBase<false>);
  (this->super_IScanner)._vptr_IScanner = (_func_int **)&PTR_GetErrorLineInfo_01e50e90;
  HashTbl::HashTbl(&this->m_htbl,0x100);
  TemporaryBuffer::TemporaryBuffer(&this->m_tempChBuf);
  TemporaryBuffer::TemporaryBuffer(&this->m_tempChBufSecondary);
  Token::Token((Token *)&this->m_tokenPrevious);
  if (ptoken == (Token *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x4a,"(ptoken)","ptoken");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this->m_parser = parser;
  this->m_ptoken = ptoken;
  this->m_scriptContext = scriptContext;
  (this->m_tempChBuf).m_pscanner = this;
  (this->m_tempChBufSecondary).m_pscanner = this;
  pCVar4 = Js::ScriptContext::GetCharClassifier(scriptContext);
  this->charClassifier = pCVar4;
  this_00 = Js::ScriptContext::GetConfig(scriptContext);
  bVar2 = Js::ScriptConfiguration::IsES6UnicodeExtensionsEnabled(this_00);
  this->es6UnicodeMode = bVar2;
  ClearStates(this);
  return;
}

Assistant:

Scanner<EncodingPolicy>::Scanner(Parser* parser, Token *ptoken, Js::ScriptContext* scriptContext)
{
    Assert(ptoken);
    m_parser = parser;
    m_ptoken = ptoken;
    m_scriptContext = scriptContext;

    m_tempChBuf.m_pscanner = this;
    m_tempChBufSecondary.m_pscanner = this;

    this->charClassifier = scriptContext->GetCharClassifier();
    this->es6UnicodeMode = scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled();

    ClearStates();
}